

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embedded_geometry_interface.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::EmbeddedGeometryInterface::computeEdgeCotanWeights
          (EmbeddedGeometryInterface *this)

{
  bool bVar1;
  SurfaceMesh *pSVar2;
  size_t sVar3;
  double *pdVar4;
  ulong uVar5;
  Vector3 *pVVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  runtime_error *this_00;
  long *plVar16;
  size_type *psVar17;
  long *plVar18;
  ParentMeshT *pPVar19;
  pointer puVar20;
  size_t sVar21;
  size_t i;
  pointer puVar22;
  pointer puVar23;
  size_t i_2;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  size_t i_1;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  undefined1 local_c8 [24];
  long lStack_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->vertexPositionsQ).super_DependentQuantity.computed == false) {
    if ((this->vertexPositionsQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->vertexPositionsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->vertexPositionsQ).super_DependentQuantity.evaluateFunc);
    (this->vertexPositionsQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Edge,_double>::MeshData
            ((MeshData<geometrycentral::surface::Edge,_double> *)local_c8,
             (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
             super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Edge,_double>::operator=
            (&(this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
              edgeCotanWeights,(MeshData<geometrycentral::surface::Edge,_double> *)local_c8);
  MeshData<geometrycentral::surface::Edge,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Edge,_double> *)local_c8);
  pSVar2 = (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
           super_BaseGeometryInterface.mesh;
  sVar3 = pSVar2->nEdgesFillCount;
  if (sVar3 != 0) {
    puVar23 = (pSVar2->eHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar22 = (pSVar2->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar20 = puVar23;
    if (pSVar2->useImplicitTwinFlag != false) {
      puVar20 = puVar22;
    }
    if (*puVar20 == 0xffffffffffffffff) {
      sVar21 = 0;
      do {
        puVar23 = puVar23 + 1;
        puVar22 = puVar22 + 2;
        if (sVar3 - 1 == sVar21) {
          return;
        }
        puVar20 = puVar23;
        if (pSVar2->useImplicitTwinFlag != false) {
          puVar20 = puVar22;
        }
        sVar21 = sVar21 + 1;
      } while (*puVar20 == 0xffffffffffffffff);
      goto LAB_0019ad7e;
    }
  }
  sVar21 = 0;
LAB_0019ad7e:
  if (sVar21 != sVar3) {
    pdVar4 = (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
             edgeCotanWeights.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    bVar1 = pSVar2->useImplicitTwinFlag;
    puVar23 = (pSVar2->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar5 = pSVar2->nFacesFillCount;
    do {
      if (bVar1 == false) {
        uVar24 = (pSVar2->eHalfedgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar21];
        uVar29 = uVar24;
      }
      else {
        uVar24 = sVar21 * 2;
        uVar29 = uVar24;
      }
      do {
        uVar25 = uVar24;
        if (puVar23[uVar24] < uVar5) break;
        if (bVar1 == false) {
          uVar24 = (pSVar2->heSiblingArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar24];
        }
        else {
          uVar24 = uVar24 ^ 1;
        }
        uVar25 = uVar29;
      } while (uVar24 != uVar29);
      uVar24 = puVar23[uVar29];
      uVar27 = uVar29;
      while (uVar5 <= uVar24) {
        if (bVar1 == false) {
          uVar27 = (pSVar2->heSiblingArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar27];
        }
        else {
          uVar27 = uVar27 ^ 1;
        }
        if (uVar27 == uVar29) {
          dVar30 = 0.0;
          uVar27 = uVar29;
          if (uVar29 == uVar25) goto LAB_0019af45;
          break;
        }
        uVar24 = puVar23[uVar27];
      }
      puVar22 = (pSVar2->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar6 = (this->vertexPositions).data.
               super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      dVar30 = 0.0;
      do {
        if (puVar22[puVar22[puVar22[uVar27]]] != uVar27) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_108,
                     "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]nonmanifold-laplacian/deps/geometry-central/src/surface/embedded_geometry_interface.cpp"
                     ,"");
          ::std::operator+(&local_70,"GC_SAFETY_ASSERT FAILURE from ",&local_108);
          plVar16 = (long *)::std::__cxx11::string::append((char *)&local_70);
          psVar17 = (size_type *)(plVar16 + 2);
          local_128._M_dataplus._M_p = (pointer)*plVar16;
          if ((size_type *)local_128._M_dataplus._M_p == psVar17) {
            local_128.field_2._M_allocated_capacity = *psVar17;
            local_128.field_2._8_8_ = plVar16[3];
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          }
          else {
            local_128.field_2._M_allocated_capacity = *psVar17;
          }
          local_128._M_string_length = plVar16[1];
          *plVar16 = (long)psVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          ::std::__cxx11::to_string(&local_90,0x135);
          ::std::operator+(&local_50,&local_128,&local_90);
          plVar16 = (long *)::std::__cxx11::string::append((char *)&local_50);
          plVar18 = plVar16 + 2;
          local_e8 = (long *)*plVar16;
          if (local_e8 == plVar18) {
            local_d8 = *plVar18;
            lStack_d0 = plVar16[3];
            local_e8 = &local_d8;
          }
          else {
            local_d8 = *plVar18;
          }
          local_e0 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          plVar16 = (long *)::std::__cxx11::string::append((char *)&local_e8);
          pPVar19 = (ParentMeshT *)(plVar16 + 2);
          local_c8._0_8_ = *plVar16;
          if ((ParentMeshT *)local_c8._0_8_ == pPVar19) {
            local_c8._16_8_ = pPVar19->_vptr_SurfaceMesh;
            lStack_b0 = plVar16[3];
            local_c8._0_8_ = (ParentMeshT *)(local_c8 + 0x10);
          }
          else {
            local_c8._16_8_ = pPVar19->_vptr_SurfaceMesh;
          }
          local_c8._8_8_ = plVar16[1];
          *plVar16 = (long)pPVar19;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          ::std::runtime_error::runtime_error(this_00,(string *)local_c8);
          __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
        }
        puVar20 = (pSVar2->heVertexArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar7 = puVar20[puVar22[puVar22[uVar27]]];
        uVar8 = puVar20[puVar22[uVar27]];
        uVar9 = puVar20[uVar27];
        dVar10 = pVVar6[uVar9].y - pVVar6[uVar7].y;
        dVar11 = pVVar6[uVar8].y - pVVar6[uVar7].y;
        dVar12 = pVVar6[uVar9].x - pVVar6[uVar7].x;
        dVar13 = pVVar6[uVar9].z - pVVar6[uVar7].z;
        dVar14 = pVVar6[uVar8].x - pVVar6[uVar7].x;
        dVar15 = pVVar6[uVar8].z - pVVar6[uVar7].z;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar14;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = dVar10 * dVar11;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = dVar12;
        auVar32 = vfmadd231sd_fma(auVar37,auVar40,auVar34);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar15;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = dVar13 * dVar11;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = dVar10;
        auVar37 = vfmsub231sd_fma(auVar38,auVar41,auVar31);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = dVar13;
        auVar31 = vfmadd231sd_fma(auVar32,auVar39,auVar31);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar12 * dVar15;
        auVar32 = vfmsub231sd_fma(auVar32,auVar34,auVar39);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = dVar10 * dVar14;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = dVar11;
        auVar34 = vfmsub231sd_fma(auVar35,auVar40,auVar36);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = auVar32._0_8_ * auVar32._0_8_;
        auVar32 = vfmadd231sd_fma(auVar33,auVar37,auVar37);
        auVar32 = vfmadd231sd_fma(auVar32,auVar34,auVar34);
        auVar32 = vsqrtsd_avx(auVar32,auVar32);
        do {
          if (bVar1 == false) {
            uVar27 = (pSVar2->heSiblingArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar27];
          }
          else {
            uVar27 = uVar27 ^ 1;
          }
        } while (uVar5 <= puVar23[uVar27]);
        dVar30 = dVar30 + (auVar31._0_8_ / auVar32._0_8_) * 0.5;
      } while (uVar27 != uVar25);
LAB_0019af45:
      lVar28 = sVar21 << 4;
      lVar26 = sVar21 * 8;
      pdVar4[sVar21] = dVar30;
      do {
        lVar26 = lVar26 + 8;
        lVar28 = lVar28 + 0x10;
        if (sVar3 - 1 == sVar21) {
          return;
        }
        plVar16 = (long *)((long)(pSVar2->eHalfedgeArr).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar26);
        if (bVar1 != false) {
          plVar16 = (long *)((long)(pSVar2->heNextArr).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar28);
        }
        sVar21 = sVar21 + 1;
      } while (*plVar16 == -1);
    } while (sVar3 != sVar21);
  }
  return;
}

Assistant:

void EmbeddedGeometryInterface::computeEdgeCotanWeights() {
  vertexPositionsQ.ensureHave();

  edgeCotanWeights = EdgeData<double>(mesh);

  for (Edge e : mesh.edges()) {
    double cotSum = 0.;

    for (Halfedge he : e.adjacentInteriorHalfedges()) {
      // WARNING: Logic duplicated between cached and immediate version
      Halfedge heFirst = he;
      Vector3 pB = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pC = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pA = vertexPositions[he.vertex()];
      GC_SAFETY_ASSERT(he.next() == heFirst, "faces must be triangular");

      Vector3 vecR = pB - pA;
      Vector3 vecL = pC - pA;

      double cotValue = dot(vecR, vecL) / norm(cross(vecR, vecL));
      cotSum += cotValue / 2;
    }

    edgeCotanWeights[e] = cotSum;
  }
}